

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O2

int __thiscall ncnn::Pooling1D::forward(Pooling1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  int i_1;
  int k;
  int k_1;
  int iVar20;
  ulong uVar21;
  float fVar22;
  Mat local_88;
  long local_38;
  
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  sVar6 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      make_padding(this,bottom_blob,&local_88,opt);
      iVar10 = local_88.h;
      iVar5 = local_88.w;
      iVar15 = -100;
      if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        uVar21 = (ulong)(uint)local_88.h;
        iVar11 = (local_88.w - this->kernel_w) / this->stride_w;
        Mat::create(top_blob,iVar11 + 1,local_88.h,sVar6,opt->blob_allocator);
        pvVar7 = top_blob->data;
        if ((pvVar7 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad != 0) {
              iVar5 = top_blob->w;
              sVar6 = top_blob->elemsize;
              iVar15 = 0;
              if (iVar10 < 1) {
                uVar21 = 0;
              }
              pvVar12 = local_88.data;
              for (uVar19 = 0; uVar19 != uVar21; uVar19 = uVar19 + 1) {
                iVar10 = this->stride_w;
                uVar2 = this->kernel_w;
                uVar3 = uVar2;
                if ((int)uVar2 < 1) {
                  uVar3 = 0;
                }
                pvVar17 = pvVar12;
                for (lVar14 = 0; lVar14 <= iVar11; lVar14 = lVar14 + 1) {
                  fVar22 = 0.0;
                  for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
                    fVar22 = fVar22 + *(float *)((long)pvVar17 + uVar16 * 4);
                  }
                  *(float *)((long)pvVar7 + lVar14 * 4 + (long)iVar5 * sVar6 * uVar19) =
                       fVar22 * (1.0 / (float)(int)uVar2);
                  pvVar17 = (void *)((long)pvVar17 + (long)iVar10 * 4);
                }
                pvVar12 = (void *)((long)pvVar12 +
                                  (long)local_88.w *
                                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
              }
              goto LAB_004ae36a;
            }
            iVar15 = 0;
            if (this->pad_mode == 0) {
              iVar15 = (bottom_blob->w - local_88.w) + this->pad_left + this->pad_right;
            }
            local_38 = (long)top_blob->w * top_blob->elemsize;
            if (iVar10 < 1) {
              uVar21 = 0;
            }
            pvVar12 = local_88.data;
            for (uVar19 = 0; uVar19 != uVar21; uVar19 = uVar19 + 1) {
              iVar10 = this->stride_w;
              uVar16 = (ulong)(uint)this->kernel_w;
              if (this->kernel_w < 1) {
                uVar16 = 0;
              }
              lVar13 = 0;
              pvVar17 = pvVar12;
              for (lVar14 = 0; lVar14 <= iVar11; lVar14 = lVar14 + 1) {
                fVar22 = 0.0;
                iVar20 = 0;
                for (uVar18 = 0; uVar16 != uVar18; uVar18 = uVar18 + 1) {
                  if ((long)this->pad_left <= (long)(uVar18 + lVar13)) {
                    if ((long)((iVar15 + iVar5) - this->pad_right) <= (long)(uVar18 + lVar13))
                    break;
                    fVar22 = fVar22 + *(float *)((long)pvVar17 + uVar18 * 4);
                    iVar20 = iVar20 + 1;
                  }
                }
                *(float *)((long)pvVar7 + lVar14 * 4 + local_38 * uVar19) = fVar22 / (float)iVar20;
                pvVar17 = (void *)((long)pvVar17 + (long)iVar10 * 4);
                lVar13 = lVar13 + iVar10;
              }
              pvVar12 = (void *)((long)pvVar12 +
                                (long)local_88.w *
                                CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
            }
          }
          else if (this->pooling_type == 0) {
            lVar14 = (long)local_88.w *
                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
            iVar5 = top_blob->w;
            sVar6 = top_blob->elemsize;
            iVar15 = 0;
            if (iVar10 < 1) {
              uVar21 = 0;
            }
            pvVar12 = local_88.data;
            for (uVar19 = 0; uVar19 != uVar21; uVar19 = uVar19 + 1) {
              uVar2 = this->kernel_w;
              if (this->kernel_w < 1) {
                uVar2 = 0;
              }
              iVar10 = this->stride_w;
              pvVar17 = pvVar12;
              for (lVar13 = 0; lVar13 <= iVar11; lVar13 = lVar13 + 1) {
                fVar22 = *(float *)((long)local_88.data + lVar13 * iVar10 * 4 + lVar14 * uVar19);
                for (uVar16 = 0; uVar2 != uVar16; uVar16 = uVar16 + 1) {
                  fVar1 = *(float *)((long)pvVar17 + uVar16 * 4);
                  if (fVar22 <= fVar1) {
                    fVar22 = fVar1;
                  }
                }
                *(float *)((long)pvVar7 + lVar13 * 4 + (long)iVar5 * sVar6 * uVar19) = fVar22;
                pvVar17 = (void *)((long)pvVar17 + (long)iVar10 * 4);
              }
              pvVar12 = (void *)((long)pvVar12 + lVar14);
            }
            goto LAB_004ae36a;
          }
          iVar15 = 0;
        }
      }
LAB_004ae36a:
      piVar9 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar9 == (int *)0x0) {
        return iVar15;
      }
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) {
        return iVar15;
      }
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        return iVar15;
      }
      free(local_88.data);
      return iVar15;
    }
    Mat::create(top_blob,this->out_w,uVar3,sVar6,opt->blob_allocator);
    pvVar7 = top_blob->data;
    if (pvVar7 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      lVar14 = (long)bottom_blob->w * bottom_blob->elemsize;
      pvVar12 = bottom_blob->data;
      iVar15 = top_blob->w;
      sVar6 = top_blob->elemsize;
      uVar4 = this->out_w;
      uVar21 = 0;
      if (0 < (int)uVar4) {
        uVar21 = (ulong)uVar4;
      }
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      pvVar17 = pvVar12;
      for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
        uVar16 = 0;
        while (uVar16 != uVar21) {
          lVar13 = (long)((int)(uVar2 * (int)uVar16) / (int)uVar4);
          fVar22 = *(float *)((long)pvVar12 + lVar13 * 4 + lVar14 * uVar19);
          for (; lVar13 < (int)((int)(uVar16 + 1) * uVar2 + (uVar4 - 1)) / (int)uVar4;
              lVar13 = lVar13 + 1) {
            fVar1 = *(float *)((long)pvVar17 + lVar13 * 4);
            if (fVar22 <= fVar1) {
              fVar22 = fVar1;
            }
          }
          *(float *)((long)pvVar7 + uVar16 * 4 + (long)iVar15 * sVar6 * uVar19) = fVar22;
          uVar16 = uVar16 + 1;
        }
        pvVar17 = (void *)((long)pvVar17 + lVar14);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      pvVar12 = bottom_blob->data;
      iVar15 = top_blob->w;
      sVar6 = top_blob->elemsize;
      uVar4 = this->out_w;
      uVar21 = 0;
      if (0 < (int)uVar4) {
        uVar21 = (ulong)uVar4;
      }
      iVar5 = bottom_blob->w;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      sVar8 = bottom_blob->elemsize;
      for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
        uVar16 = 0;
        while (uVar16 != uVar21) {
          iVar11 = (int)(uVar2 * (int)uVar16) / (int)uVar4;
          iVar10 = (int)((int)(uVar16 + 1) * uVar2 + (uVar4 - 1)) / (int)uVar4;
          fVar22 = 0.0;
          for (lVar14 = (long)iVar11; lVar14 < iVar10; lVar14 = lVar14 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar12 + lVar14 * 4);
          }
          *(float *)((long)pvVar7 + uVar16 * 4 + (long)iVar15 * sVar6 * uVar19) =
               fVar22 / (float)(iVar10 - iVar11);
          uVar16 = uVar16 + 1;
        }
        pvVar12 = (void *)((long)pvVar12 + (long)iVar5 * sVar8);
      }
      return 0;
    }
  }
  else {
    Mat::create(top_blob,uVar3,sVar6,opt->blob_allocator);
    pvVar7 = top_blob->data;
    if (pvVar7 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      pvVar12 = bottom_blob->data;
      lVar14 = (long)bottom_blob->w * bottom_blob->elemsize;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      uVar21 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar21 = 0;
      }
      pvVar17 = pvVar12;
      for (uVar19 = 0; uVar19 != uVar21; uVar19 = uVar19 + 1) {
        fVar22 = *(float *)((long)pvVar12 + lVar14 * uVar19);
        for (uVar16 = 0; uVar2 != uVar16; uVar16 = uVar16 + 1) {
          fVar1 = *(float *)((long)pvVar17 + uVar16 * 4);
          if (fVar22 <= fVar1) {
            fVar22 = fVar1;
          }
        }
        *(float *)((long)pvVar7 + uVar19 * 4) = fVar22;
        pvVar17 = (void *)((long)pvVar17 + lVar14);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      pvVar12 = bottom_blob->data;
      iVar15 = bottom_blob->w;
      uVar21 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar21 = 0;
      }
      uVar19 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar19 = 0;
      }
      sVar6 = bottom_blob->elemsize;
      for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
        fVar22 = 0.0;
        for (uVar18 = 0; uVar21 != uVar18; uVar18 = uVar18 + 1) {
          fVar22 = fVar22 + *(float *)((long)pvVar12 + uVar18 * 4);
        }
        *(float *)((long)pvVar7 + uVar16 * 4) = fVar22 * (1.0 / (float)(int)uVar2);
        pvVar12 = (void *)((long)pvVar12 + (long)iVar15 * sVar6);
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling1D     input %d x %d  pad = %d %d  ksize=%d  stride=%d", w, h, pad_left, pad_right, kernel_w, stride_w);
    if (global_pooling)
    {
        top_blob.create(h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float max = ptr[0];
                for (int i = 0; i < w; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float sum = 0.f;
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / w;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                    float max = inptr[iw0];
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        max = std::max(max, inptr[iw]);
                    }

                    outptr[j] = max;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                    const int wk = iw1 - iw0;

                    float sum = 0;
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        sum += inptr[iw];
                    }

                    outptr[j] = sum / wk;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;

    top_blob.create(outw, h, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < h; q++)
        {
            const float* ptr = bottom_blob_bordered.row(q);
            float* outptr = top_blob.row(q);

            for (int j = 0; j < outw; j++)
            {
                const float* sptr = ptr + j * stride_w;

                float max = sptr[0];

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = sptr[k];
                    max = std::max(max, val);
                }

                outptr[j] = max;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    int sx0 = j * stride_w;

                    float sum = 0;
                    int area = 0;

                    for (int kj = 0; kj < kernel_w; kj++)
                    {
                        int sx = sx0 + kj;

                        if (sx < pad_left)
                            continue;

                        if (sx >= w - pad_right - wtailpad)
                            break;

                        float val = ptr[sx];
                        sum += val;
                        area += 1;
                    }

                    outptr[j] = sum / area;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = ptr + j * stride_w;

                    float sum = 0;

                    for (int k = 0; k < kernel_w; k++)
                    {
                        float val = sptr[k];
                        sum += val;
                    }

                    outptr[j] = sum / kernel_w;
                }
            }
        }
    }

    return 0;
}